

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O3

void __thiscall
xLearn::DMATRIX_TEST_Reset_Test::~DMATRIX_TEST_Reset_Test(DMATRIX_TEST_Reset_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(DMATRIX_TEST, Reset) {
  DMatrix matrix;
  matrix.Reset();
  EXPECT_EQ(matrix.has_label, true);
  EXPECT_EQ(matrix.hash_value_1, 0);
  EXPECT_EQ(matrix.hash_value_2, 0);
  EXPECT_EQ(matrix.row_length, 0);
  EXPECT_EQ(matrix.pos, 0);
  EXPECT_EQ(matrix.Y.empty(), true);
  EXPECT_EQ(matrix.norm.empty(), true);
  EXPECT_EQ(matrix.row.empty(),true);
}